

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib540.c
# Opt level: O3

int loop(int num,CURLM *cm,char *url,char *userpwd,curl_slist *headers)

{
  int iVar1;
  CURL *pCVar2;
  undefined8 uVar3;
  long lVar4;
  CURL **ppCVar5;
  int *piVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  char *pcVar9;
  ulong uVar10;
  CURLM *pCVar11;
  timeval tVar12;
  timeval older;
  timeval older_00;
  int U;
  int M;
  long L;
  int Q;
  fd_set E;
  fd_set W;
  fd_set R;
  int local_1e8;
  int local_1e4;
  CURLM *local_1e0;
  timeval local_1d8;
  ulong local_1c8;
  undefined1 local_1bc [4];
  fd_set local_1b8;
  fd_set local_138;
  fd_set local_b8;
  
  local_1e8 = -1;
  local_1e0 = cm;
  pCVar2 = (CURL *)curl_easy_init();
  eh[(uint)num] = pCVar2;
  if (pCVar2 == (CURL *)0x0) {
    curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib540.c"
                  ,0x36);
    iVar1 = 0x7c;
  }
  else {
    iVar1 = curl_easy_setopt(pCVar2,0x2712,url);
    uVar8 = _stderr;
    if (iVar1 == 0) {
      iVar1 = curl_easy_setopt(eh[(uint)num],0x2714,libtest_arg2);
      uVar8 = _stderr;
      if (iVar1 == 0) {
        iVar1 = curl_easy_setopt(eh[(uint)num],0x2716,userpwd);
        uVar8 = _stderr;
        if (iVar1 == 0) {
          iVar1 = curl_easy_setopt(eh[(uint)num],0x6f,0xffffffffffffffef);
          uVar8 = _stderr;
          if (iVar1 == 0) {
            iVar1 = curl_easy_setopt(eh[(uint)num],0x29,1);
            uVar8 = _stderr;
            if (iVar1 == 0) {
              iVar1 = curl_easy_setopt(eh[(uint)num],0x2a,1);
              uVar8 = _stderr;
              if (iVar1 == 0) {
                iVar1 = curl_easy_setopt(eh[(uint)num],0x2727,headers);
                pCVar11 = local_1e0;
                uVar8 = _stderr;
                if (iVar1 == 0) {
                  iVar1 = curl_multi_add_handle(local_1e0,eh[(uint)num]);
                  uVar8 = _stderr;
                  if (iVar1 == 0) {
                    do {
                      local_1e4 = -99;
                      iVar1 = curl_multi_perform(pCVar11,&local_1e8);
                      uVar8 = _stderr;
                      if (iVar1 != 0) {
                        uVar3 = curl_multi_strerror(iVar1);
                        pcVar9 = "%s:%d curl_multi_perform() failed, with code %d (%s)\n";
                        uVar7 = 0x76;
                        goto LAB_00102b23;
                      }
                      if (local_1e8 < 0) {
                        pcVar9 = 
                        "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                        ;
                        uVar8 = 0x76;
LAB_00102aef:
                        curl_mfprintf(_stderr,pcVar9,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib540.c"
                                      ,uVar8);
                        return 0x7a;
                      }
                      tVar12 = tutil_tvnow();
                      older.tv_usec = tv_test_start.tv_usec;
                      older.tv_sec = tv_test_start.tv_sec;
                      lVar4 = tutil_tvdiff(tVar12,older);
                      if (60000 < lVar4) {
                        uVar8 = 0x7a;
LAB_00102aa2:
                        curl_mfprintf(_stderr,
                                      "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                      ,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib540.c"
                                      ,uVar8);
                        return 0x7d;
                      }
                      if (local_1e8 != 0) {
                        local_b8.__fds_bits[0xe] = 0;
                        local_b8.__fds_bits[0xf] = 0;
                        local_b8.__fds_bits[0xc] = 0;
                        local_b8.__fds_bits[0xd] = 0;
                        local_b8.__fds_bits[10] = 0;
                        local_b8.__fds_bits[0xb] = 0;
                        local_b8.__fds_bits[8] = 0;
                        local_b8.__fds_bits[9] = 0;
                        local_b8.__fds_bits[6] = 0;
                        local_b8.__fds_bits[7] = 0;
                        local_b8.__fds_bits[4] = 0;
                        local_b8.__fds_bits[5] = 0;
                        local_b8.__fds_bits[2] = 0;
                        local_b8.__fds_bits[3] = 0;
                        local_b8.__fds_bits[0] = 0;
                        local_b8.__fds_bits[1] = 0;
                        local_138.__fds_bits[0] = 0;
                        local_138.__fds_bits[1] = 0;
                        local_138.__fds_bits[2] = 0;
                        local_138.__fds_bits[3] = 0;
                        local_138.__fds_bits[4] = 0;
                        local_138.__fds_bits[5] = 0;
                        local_138.__fds_bits[6] = 0;
                        local_138.__fds_bits[7] = 0;
                        local_138.__fds_bits[8] = 0;
                        local_138.__fds_bits[9] = 0;
                        local_138.__fds_bits[10] = 0;
                        local_138.__fds_bits[0xb] = 0;
                        local_138.__fds_bits[0xc] = 0;
                        local_138.__fds_bits[0xd] = 0;
                        local_138.__fds_bits[0xe] = 0;
                        local_138.__fds_bits[0xf] = 0;
                        local_1b8.__fds_bits[0] = 0;
                        local_1b8.__fds_bits[1] = 0;
                        local_1b8.__fds_bits[2] = 0;
                        local_1b8.__fds_bits[3] = 0;
                        local_1b8.__fds_bits[4] = 0;
                        local_1b8.__fds_bits[5] = 0;
                        local_1b8.__fds_bits[6] = 0;
                        local_1b8.__fds_bits[7] = 0;
                        local_1b8.__fds_bits[8] = 0;
                        local_1b8.__fds_bits[9] = 0;
                        local_1b8.__fds_bits[10] = 0;
                        local_1b8.__fds_bits[0xb] = 0;
                        local_1b8.__fds_bits[0xc] = 0;
                        local_1b8.__fds_bits[0xd] = 0;
                        local_1b8.__fds_bits[0xe] = 0;
                        local_1b8.__fds_bits[0xf] = 0;
                        iVar1 = curl_multi_fdset(pCVar11,&local_b8,&local_138,&local_1b8,&local_1e4)
                        ;
                        uVar8 = _stderr;
                        if (iVar1 != 0) {
                          uVar3 = curl_multi_strerror(iVar1);
                          pcVar9 = "%s:%d curl_multi_fdset() failed, with code %d (%s)\n";
                          uVar7 = 0x83;
LAB_00102b23:
                          curl_mfprintf(uVar8,pcVar9,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib540.c"
                                        ,uVar7,iVar1,uVar3);
                          return iVar1;
                        }
                        if (local_1e4 < -1) {
                          pcVar9 = 
                          "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n"
                          ;
                          uVar8 = 0x83;
                          goto LAB_00102aef;
                        }
                        iVar1 = curl_multi_timeout(pCVar11,&local_1c8);
                        uVar8 = _stderr;
                        if (iVar1 != 0) {
                          uVar3 = curl_multi_strerror(iVar1);
                          pcVar9 = "%s:%d curl_multi_timeout() failed, with code %d (%s)\n";
                          uVar7 = 0x89;
                          goto LAB_00102b23;
                        }
                        if ((long)local_1c8 < -1) {
                          curl_mfprintf(_stderr,
                                        "%s:%d curl_multi_timeout() succeeded, but returned invalid timeout value (%ld)\n"
                                        ,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib540.c"
                                        ,0x89);
                          return 0x73;
                        }
                        if (local_1c8 == 0xffffffffffffffff) {
                          local_1d8.tv_sec = 5;
                          local_1d8.tv_usec = 0;
                        }
                        else {
                          uVar10 = local_1c8;
                          if (0x7ffffffe < local_1c8) {
                            uVar10 = 0x7fffffff;
                          }
                          local_1d8.tv_sec = uVar10 * 0x10624dd3 >> 0x26;
                          local_1d8.tv_usec =
                               (__suseconds_t)
                               (((int)uVar10 + (uint)(uVar10 * 0x10624dd3 >> 0x26) * -1000) * 1000);
                        }
                        iVar1 = select_wrapper(local_1e4 + 1,&local_b8,&local_138,&local_1b8,
                                               &local_1d8);
                        if (iVar1 == -1) {
                          piVar6 = __errno_location();
                          uVar8 = _stderr;
                          iVar1 = *piVar6;
                          pcVar9 = strerror(iVar1);
                          curl_mfprintf(uVar8,"%s:%d select() failed, with errno %d (%s)\n",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib540.c"
                                        ,0x99,iVar1,pcVar9);
                          return 0x79;
                        }
                      }
                      while (piVar6 = (int *)curl_multi_info_read(pCVar11,local_1bc),
                            uVar8 = _stderr, piVar6 != (int *)0x0) {
                        if (*piVar6 == 1) {
                          pCVar2 = *(CURL **)(piVar6 + 2);
                          iVar1 = piVar6[4];
                          uVar3 = curl_easy_strerror(iVar1);
                          pCVar11 = local_1e0;
                          curl_mfprintf(uVar8,"R: %d - %s\n",iVar1,uVar3);
                          curl_multi_remove_handle(pCVar11,pCVar2);
                          curl_easy_cleanup(pCVar2);
                          ppCVar5 = eh;
                          if ((eh[0] == pCVar2) || (ppCVar5 = eh + 1, eh[1] == pCVar2)) {
                            *ppCVar5 = (CURL *)0x0;
                          }
                        }
                        else {
                          curl_mfprintf(_stderr,"E: CURLMsg (%d)\n");
                        }
                      }
                      tVar12 = tutil_tvnow();
                      older_00.tv_usec = tv_test_start.tv_usec;
                      older_00.tv_sec = tv_test_start.tv_sec;
                      lVar4 = tutil_tvdiff(tVar12,older_00);
                      if (60000 < lVar4) {
                        uVar8 = 0xb1;
                        goto LAB_00102aa2;
                      }
                      if (local_1e8 == 0) {
                        return 0;
                      }
                    } while( true );
                  }
                  uVar3 = curl_multi_strerror(iVar1);
                  pcVar9 = "%s:%d curl_multi_add_handle() failed, with code %d (%s)\n";
                  uVar7 = 0x56;
                }
                else {
                  uVar3 = curl_easy_strerror(iVar1);
                  pcVar9 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
                  uVar7 = 0x52;
                }
              }
              else {
                uVar3 = curl_easy_strerror(iVar1);
                pcVar9 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
                uVar7 = 0x4e;
              }
            }
            else {
              uVar3 = curl_easy_strerror(iVar1);
              pcVar9 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
              uVar7 = 0x4a;
            }
          }
          else {
            uVar3 = curl_easy_strerror(iVar1);
            pcVar9 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
            uVar7 = 0x46;
          }
        }
        else {
          uVar3 = curl_easy_strerror(iVar1);
          pcVar9 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
          uVar7 = 0x42;
        }
      }
      else {
        uVar3 = curl_easy_strerror(iVar1);
        pcVar9 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
        uVar7 = 0x3e;
      }
    }
    else {
      uVar3 = curl_easy_strerror(iVar1);
      pcVar9 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
      uVar7 = 0x3a;
    }
    curl_mfprintf(uVar8,pcVar9,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib540.c"
                  ,uVar7,iVar1,uVar3);
  }
  curl_easy_cleanup(eh[(uint)num]);
  eh[(uint)num] = (CURL *)0x0;
  return iVar1;
}

Assistant:

static int loop(int num, CURLM *cm, const char *url, const char *userpwd,
                struct curl_slist *headers)
{
  CURLMsg *msg;
  long L;
  int Q, U = -1;
  fd_set R, W, E;
  struct timeval T;
  int res = 0;

  res = init(num, cm, url, userpwd, headers);
  if(res)
    return res;

  while(U) {

    int M = -99;

    res_multi_perform(cm, &U);
    if(res)
      return res;

    res_test_timedout();
    if(res)
      return res;

    if(U) {
      FD_ZERO(&R);
      FD_ZERO(&W);
      FD_ZERO(&E);

      res_multi_fdset(cm, &R, &W, &E, &M);
      if(res)
        return res;

      /* At this point, M is guaranteed to be greater or equal than -1. */

      res_multi_timeout(cm, &L);
      if(res)
        return res;

      /* At this point, L is guaranteed to be greater or equal than -1. */

      if(L != -1) {
        int itimeout = (L > (long)INT_MAX) ? INT_MAX : (int)L;
        T.tv_sec = itimeout/1000;
        T.tv_usec = (itimeout%1000)*1000;
      }
      else {
        T.tv_sec = 5;
        T.tv_usec = 0;
      }

      res_select_test(M + 1, &R, &W, &E, &T);
      if(res)
        return res;
    }

    while((msg = curl_multi_info_read(cm, &Q)) != NULL) {
      if(msg->msg == CURLMSG_DONE) {
        int i;
        CURL *e = msg->easy_handle;
        fprintf(stderr, "R: %d - %s\n", (int)msg->data.result,
                curl_easy_strerror(msg->data.result));
        curl_multi_remove_handle(cm, e);
        curl_easy_cleanup(e);
        for(i = 0; i < NUM_HANDLES; i++) {
          if(eh[i] == e) {
            eh[i] = NULL;
            break;
          }
        }
      }
      else
        fprintf(stderr, "E: CURLMsg (%d)\n", (int)msg->msg);
    }

    res_test_timedout();
    if(res)
      return res;
  }

  return 0; /* success */
}